

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

void dg::dda::recGatherNonPhisDefs
               (RWNode *phi,SparseBitvectorHashImpl *phis,SparseBitvectorHashImpl *ret,
               bool intraproc)

{
  pointer ppRVar1;
  RWNode *phi_00;
  bool bVar2;
  pointer ppRVar3;
  
  bVar2 = ADT::
          SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          ::set(phis,(ulong)(phi->super_SubgraphNode<dg::dda::RWNode>).id);
  if (!bVar2) {
    ppRVar1 = (phi->defuse).defuse.
              super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppRVar3 = (phi->defuse).defuse.
                   super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppRVar3 != ppRVar1; ppRVar3 = ppRVar3 + 1) {
      phi_00 = *ppRVar3;
      if ((4 < phi_00->type - PHI) || ((intraproc && (phi_00->type - INARG < 4)))) {
        ADT::
        SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
        ::set(ret,(ulong)(phi_00->super_SubgraphNode<dg::dda::RWNode>).id);
      }
      else {
        recGatherNonPhisDefs(phi_00,phis,ret,intraproc);
      }
    }
  }
  return;
}

Assistant:

static void recGatherNonPhisDefs(RWNode *phi,
                                 dg::ADT::SparseBitvectorHashImpl &phis,
                                 dg::ADT::SparseBitvectorHashImpl &ret,
                                 bool intraproc = false) {
    assert(phi->isPhi());
    // set returns the previous value, so if its 'true',
    // we already had the phi
    if (phis.set(phi->getID()))
        return; // we already visited this phi

    for (auto *n : phi->defuse) {
        if (!n->isPhi()) {
            ret.set(n->getID());
        } else {
            if (intraproc && n->isInOut()) {
                ret.set(n->getID());
            } else {
                recGatherNonPhisDefs(n, phis, ret, intraproc);
            }
        }
    }
}